

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O1

string * __thiscall
rcg::Device::getUserDefinedName_abi_cxx11_(string *__return_storage_ptr__,Device *this)

{
  mutex *__mutex;
  Interface *pIVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  PIFGetDeviceInfo p_Var3;
  pointer pcVar4;
  int iVar5;
  GC_ERROR GVar6;
  void *pvVar7;
  undefined8 uVar8;
  DEVICE_INFO_CMD in_R8D;
  size_t *psVar9;
  char *pcVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_R12;
  ulong uVar11;
  INFO_DATATYPE type;
  size_t tmp_size;
  char tmp [100];
  pointer local_d0;
  INFO_DATATYPE local_c4;
  size_t local_c0;
  char local_b8 [104];
  string local_50;
  
  __mutex = &this->mtx;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
    uVar8 = std::__throw_system_error(iVar5);
    if (unaff_R12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_R12);
    }
    pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if (pcVar4 != local_d0) {
      operator_delete(pcVar4);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar8);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_c4 = 0;
  local_b8[0x60] = '\0';
  local_b8[0x61] = '\0';
  local_b8[0x62] = '\0';
  local_b8[99] = '\0';
  local_b8[0x50] = '\0';
  local_b8[0x51] = '\0';
  local_b8[0x52] = '\0';
  local_b8[0x53] = '\0';
  local_b8[0x54] = '\0';
  local_b8[0x55] = '\0';
  local_b8[0x56] = '\0';
  local_b8[0x57] = '\0';
  local_b8[0x58] = '\0';
  local_b8[0x59] = '\0';
  local_b8[0x5a] = '\0';
  local_b8[0x5b] = '\0';
  local_b8[0x5c] = '\0';
  local_b8[0x5d] = '\0';
  local_b8[0x5e] = '\0';
  local_b8[0x5f] = '\0';
  local_b8[0x40] = '\0';
  local_b8[0x41] = '\0';
  local_b8[0x42] = '\0';
  local_b8[0x43] = '\0';
  local_b8[0x44] = '\0';
  local_b8[0x45] = '\0';
  local_b8[0x46] = '\0';
  local_b8[0x47] = '\0';
  local_b8[0x48] = '\0';
  local_b8[0x49] = '\0';
  local_b8[0x4a] = '\0';
  local_b8[0x4b] = '\0';
  local_b8[0x4c] = '\0';
  local_b8[0x4d] = '\0';
  local_b8[0x4e] = '\0';
  local_b8[0x4f] = '\0';
  local_b8[0x30] = '\0';
  local_b8[0x31] = '\0';
  local_b8[0x32] = '\0';
  local_b8[0x33] = '\0';
  local_b8[0x34] = '\0';
  local_b8[0x35] = '\0';
  local_b8[0x36] = '\0';
  local_b8[0x37] = '\0';
  local_b8[0x38] = '\0';
  local_b8[0x39] = '\0';
  local_b8[0x3a] = '\0';
  local_b8[0x3b] = '\0';
  local_b8[0x3c] = '\0';
  local_b8[0x3d] = '\0';
  local_b8[0x3e] = '\0';
  local_b8[0x3f] = '\0';
  local_b8[0x20] = '\0';
  local_b8[0x21] = '\0';
  local_b8[0x22] = '\0';
  local_b8[0x23] = '\0';
  local_b8[0x24] = '\0';
  local_b8[0x25] = '\0';
  local_b8[0x26] = '\0';
  local_b8[0x27] = '\0';
  local_b8[0x28] = '\0';
  local_b8[0x29] = '\0';
  local_b8[0x2a] = '\0';
  local_b8[0x2b] = '\0';
  local_b8[0x2c] = '\0';
  local_b8[0x2d] = '\0';
  local_b8[0x2e] = '\0';
  local_b8[0x2f] = '\0';
  local_b8[0x10] = '\0';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  local_b8[0x14] = '\0';
  local_b8[0x15] = '\0';
  local_b8[0x16] = '\0';
  local_b8[0x17] = '\0';
  local_b8[0x18] = '\0';
  local_b8[0x19] = '\0';
  local_b8[0x1a] = '\0';
  local_b8[0x1b] = '\0';
  local_b8[0x1c] = '\0';
  local_b8[0x1d] = '\0';
  local_b8[0x1e] = '\0';
  local_b8[0x1f] = '\0';
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = '\0';
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  local_c0 = 100;
  if (this->dev == (DEV_HANDLE)0x0) {
    pIVar1 = (this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    pvVar7 = Interface::getHandle(pIVar1);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (pvVar7 == (void *)0x0) {
      GVar6 = -0x3e9;
    }
    else {
      p_Var3 = ((this->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               IFGetDeviceInfo;
      pIVar1 = (this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      pvVar7 = Interface::getHandle(pIVar1);
      pcVar10 = local_b8;
      GVar6 = (*p_Var3)(pvVar7,(this->id)._M_dataplus._M_p,6,&local_c4,pcVar10,&local_c0);
      in_R8D = (DEVICE_INFO_CMD)pcVar10;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
  }
  else {
    psVar9 = &local_c0;
    GVar6 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->DevGetInfo)(this->dev,6,&local_c4,local_b8,psVar9);
    in_R8D = (DEVICE_INFO_CMD)psVar9;
  }
  if ((GVar6 == 0) && (local_c4 == 1)) {
    if (local_c0 != 0) {
      uVar11 = 0;
      do {
        if (local_b8[uVar11] == '\0') break;
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar11 = uVar11 + 1;
      } while (uVar11 < local_c0);
    }
  }
  else {
    (anonymous_namespace)::cDevGetInfo_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)this,(Device *)&this->gentl,
               (shared_ptr<const_rcg::GenTLWrapper> *)0x4,in_R8D);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return __return_storage_ptr__;
}

Assistant:

std::string Device::getUserDefinedName()
{
  std::lock_guard<std::mutex> lock(mtx);
  std::string ret;

  // try to get user defined name

  GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
  char tmp[100]="";
  size_t tmp_size=sizeof(tmp);
  GenTL::GC_ERROR err=GenTL::GC_ERR_ERROR;

  if (getHandle() != 0)
  {
    err=gentl->DevGetInfo(getHandle(), GenTL::DEVICE_INFO_USER_DEFINED_NAME, &type, tmp,
      &tmp_size);
  }
  else if (getParent()->getHandle() != 0)
  {
    err=gentl->IFGetDeviceInfo(getParent()->getHandle(), getID().c_str(),
      GenTL::DEVICE_INFO_USER_DEFINED_NAME, &type, tmp, &tmp_size);
  }

  if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_STRING)
  {
    for (size_t i=0; i<tmp_size && tmp[i] != '\0'; i++)
    {
      ret.push_back(tmp[i]);
    }
  }
  else
  {
    // since user defined name is optional, fall back to display name in case
    // of an error

    ret=cDevGetInfo(this, gentl, GenTL::DEVICE_INFO_DISPLAYNAME);
  }

  return ret;
}